

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

void __thiscall MppBufferService::inc_total(MppBufferService *this,RK_U32 size)

{
  RK_U32 *pRVar1;
  RK_U32 RVar2;
  uint uVar3;
  bool bVar4;
  uint local_34;
  RK_U32 new_max;
  RK_U32 old_max;
  bool ret;
  RK_U32 total;
  RK_U32 size_local;
  MppBufferService *this_local;
  
  LOCK();
  pRVar1 = &this->total_size;
  RVar2 = *pRVar1;
  *pRVar1 = *pRVar1 + size;
  UNLOCK();
  do {
    uVar3 = this->total_max;
    local_34 = uVar3;
    if (uVar3 < RVar2 + size) {
      local_34 = RVar2 + size;
    }
    LOCK();
    bVar4 = uVar3 == this->total_max;
    if (bVar4) {
      this->total_max = local_34;
    }
    UNLOCK();
  } while (!bVar4);
  return;
}

Assistant:

void MppBufferService::inc_total(RK_U32 size)
{
    RK_U32 total = MPP_ADD_FETCH(&total_size, size);
    bool ret;

    do {
        RK_U32 old_max = total_max;
        RK_U32 new_max = MPP_MAX(total, old_max);

        ret = MPP_BOOL_CAS(&total_max, old_max, new_max);
    } while (!ret);
}